

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

vec4 __thiscall vera::Triangle::getClosestRGBSignedDistance(Triangle *this,vec3 *_p)

{
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *this_00;
  vec3 *pvVar1;
  float fVar2;
  vec3 vVar3;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  vec4 vVar5;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_12c;
  vec<3,_float,_(glm::qualifier)0> local_108;
  vec<3,_float,_(glm::qualifier)0> local_f4;
  vec<3,_float,_(glm::qualifier)0> local_e8;
  vec<3,_float,_(glm::qualifier)0> local_d8;
  vec3 local_c8;
  vec<3,_float,_(glm::qualifier)0> local_b8;
  vec<3,_float,_(glm::qualifier)0> local_a8;
  undefined1 local_98 [8];
  vec3 u;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_84;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_80;
  undefined1 local_78 [8];
  vec3 barycentric;
  undefined1 local_48 [8];
  vec3 pseudo_normal;
  vec3 nearest;
  vec3 *_p_local;
  Triangle *this_local;
  vec4 c;
  
  this_00 = &pseudo_normal.field_2;
  glm::vec<3,_float,_(glm::qualifier)0>::vec((vec<3,_float,_(glm::qualifier)0> *)this_00,0.0);
  pvVar1 = getNormal(this);
  pseudo_normal.field_0 =
       *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)&pvVar1->field_2;
  local_48._0_4_ = pvVar1->field_0;
  local_48._4_4_ = pvVar1->field_1;
  join_0x00001240_0x00001200_ = getClosestPoint(this,_p);
  stack0xffffffffffffffc8 = stack0xffffffffffffff98;
  vVar3 = getBarycentricOf(this,(vec3 *)this_00);
  local_80 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar3.field_2;
  barycentric.field_0 = local_80;
  stack0xffffffffffffff78 = vVar3._0_8_;
  local_78._0_4_ = u.field_2;
  local_78._4_4_ = aStack_84;
  unique0x1000017f = vVar3;
  vVar5 = getColor(this,(vec3 *)local_78);
  vVar4 = glm::operator-(_p,(vec<3,_float,_(glm::qualifier)0> *)this_00);
  local_a8.field_2 = vVar4.field_2;
  u.field_0.x = local_a8.field_2.z;
  local_a8._0_8_ = vVar4._0_8_;
  local_98._0_4_ = local_a8.field_0;
  local_98._4_4_ = local_a8.field_1;
  local_a8 = vVar4;
  local_12c.w = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_98)
  ;
  _this_local = vVar5._0_12_;
  vVar3 = getNormal(this,(vec3 *)local_78);
  local_c8.field_2 = vVar3.field_2;
  local_b8.field_2 = local_c8.field_2;
  local_c8._0_8_ = vVar3._0_8_;
  local_b8.field_0 = local_c8.field_0;
  local_b8.field_1 = local_c8.field_1;
  pseudo_normal.field_0.x = local_c8.field_2.z;
  local_48._0_4_ = local_c8.field_0;
  local_48._4_4_ = local_c8.field_1;
  local_c8 = vVar3;
  vVar4 = glm::normalize<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_98);
  local_e8.field_2 = vVar4.field_2;
  local_d8.field_2 = local_e8.field_2;
  local_e8._0_8_ = vVar4._0_8_;
  local_d8.field_0 = local_e8.field_0;
  local_d8.field_1 = local_e8.field_1;
  local_e8 = vVar4;
  vVar4 = glm::normalize<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_48);
  local_108._0_8_ = vVar4._0_8_;
  local_f4.field_0 = local_108.field_0;
  local_f4.field_1 = local_108.field_1;
  local_108.field_2 = vVar4.field_2;
  local_f4.field_2 = local_108.field_2;
  fVar2 = glm::dot<3,float,(glm::qualifier)0>(&local_d8,&local_f4);
  if (fVar2 < 0.0) {
    local_12c.w = local_12c.w ^ 0x80000000;
  }
  c.field_1.y = local_12c.w;
  return _this_local;
}

Assistant:

glm::vec4 Triangle::getClosestRGBSignedDistance(const glm::vec3& _p) const {
    glm::vec3 nearest = glm::vec3(0.0);
    glm::vec3 pseudo_normal = getNormal();

    nearest = getClosestPoint(_p);

    glm::vec3 barycentric = getBarycentricOf(nearest);
    glm::vec4 c = getColor( barycentric );

    glm::vec3 u = _p - nearest;
    c.a = glm::length(u);
    // c.a = unsignedDistance(_p);

    pseudo_normal = getNormal( barycentric );

    c.a = (glm::dot( glm::normalize(u), glm::normalize(pseudo_normal) ) >= 0.0)? c.a : -c.a; 
    // c.a *= glm::sign( glm::dot(_p, m_normal) - glm::dot(m_vertices[0], m_normal) );

    return c;
}